

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

DAngle __thiscall UDMFParserBase::CheckAngle(UDMFParserBase *this,char *key)

{
  char *in_RDX;
  double amt;
  TAngle<double> TVar1;
  TAngle<double> local_28 [2];
  char *key_local;
  UDMFParserBase *this_local;
  
  key_local = key;
  this_local = this;
  amt = CheckFloat((UDMFParserBase *)key,in_RDX);
  TAngle<double>::TAngle(local_28,amt);
  TVar1 = TAngle<double>::Normalized360((TAngle<double> *)this);
  return (DAngle)TVar1.Degrees;
}

Assistant:

DAngle UDMFParserBase::CheckAngle(const char *key)
{
	return DAngle(CheckFloat(key)).Normalized360();
}